

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O3

glyph_t * plutovg_font_face_get_glyph(plutovg_font_face_t *face,plutovg_codepoint_t codepoint)

{
  stbtt_fontinfo *info;
  int iVar1;
  uchar *puVar2;
  long lVar3;
  ushort uVar4;
  int iVar5;
  glyph_t **ppgVar6;
  stbtt_vertex **pvertices;
  ushort uVar7;
  uint uVar8;
  ushort *puVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ushort uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  stbtt__csctx local_68;
  
  uVar12 = (ulong)(codepoint >> 8) & 0xff;
  ppgVar6 = face->glyphs[uVar12];
  if (ppgVar6 == (glyph_t **)0x0) {
    ppgVar6 = (glyph_t **)calloc(0x100,8);
    face->glyphs[uVar12] = ppgVar6;
  }
  if (ppgVar6[(ulong)codepoint & 0xff] != (glyph_t *)0x0) {
    return ppgVar6[(ulong)codepoint & 0xff];
  }
  pvertices = (stbtt_vertex **)malloc(0x28);
  puVar2 = (face->info).data;
  uVar8 = (face->info).index_map;
  uVar10 = (ulong)uVar8;
  uVar7 = *(ushort *)(puVar2 + uVar10) << 8;
  uVar4 = *(ushort *)(puVar2 + uVar10) >> 8;
  uVar14 = uVar7 | uVar4;
  switch(uVar14) {
  case 0:
    if ((int)((ushort)(*(ushort *)(puVar2 + uVar10 + 2) << 8 | *(ushort *)(puVar2 + uVar10 + 2) >> 8
                      ) - 6) <= (int)codepoint) goto LAB_00125031;
    uVar15 = (uint)puVar2[(long)(int)codepoint + uVar10 + 6];
    break;
  default:
    if ((uVar7 | uVar4 & 0xfffe) != 0xc) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-truetype.h"
                    ,0x631,"int stbtt_FindGlyphIndex(const stbtt_fontinfo *, int)");
    }
    uVar8 = *(uint *)(puVar2 + uVar10 + 0xc);
    uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    if (0 < (int)uVar8) {
      iVar5 = 0;
      do {
        uVar13 = ((int)(uVar8 - iVar5) >> 1) + iVar5;
        lVar3 = (long)(int)uVar13 * 0xc;
        uVar15 = *(uint *)(puVar2 + lVar3 + uVar10 + 0x10);
        uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18
        ;
        if (uVar15 <= codepoint) {
          uVar16 = *(uint *)(puVar2 + lVar3 + uVar10 + 0x14);
          if (codepoint <=
              (uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18))
          {
            uVar8 = *(uint *)(puVar2 + lVar3 + uVar10 + 0x18);
            iVar5 = 0;
            if (uVar14 == 0xc) {
              iVar5 = codepoint - uVar15;
            }
            uVar15 = iVar5 + (uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                             uVar8 << 0x18);
            goto LAB_001251d6;
          }
          iVar5 = uVar13 + 1;
          uVar13 = uVar8;
        }
        uVar8 = uVar13;
      } while (iVar5 < (int)uVar8);
    }
LAB_00125031:
    uVar15 = 0;
    break;
  case 2:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-truetype.h"
                  ,0x5ea,"int stbtt_FindGlyphIndex(const stbtt_fontinfo *, int)");
  case 4:
    if (0xffff < (int)codepoint) goto LAB_00125031;
    uVar7 = *(ushort *)(puVar2 + uVar10 + 6) << 8 | *(ushort *)(puVar2 + uVar10 + 6) >> 8;
    uVar4 = *(ushort *)(puVar2 + uVar10 + 10) << 8 | *(ushort *)(puVar2 + uVar10 + 10) >> 8;
    uVar17 = (ulong)(puVar2[uVar10 + 0xd] & 0xfffffffe) | (ulong)puVar2[uVar10 + 0xc] << 8;
    if ((int)codepoint <
        (int)(uint)(ushort)(*(ushort *)(puVar2 + uVar17 + (uVar8 + 0xe)) << 8 |
                           *(ushort *)(puVar2 + uVar17 + (uVar8 + 0xe)) >> 8)) {
      uVar17 = 0;
    }
    uVar15 = uVar8 + (int)uVar17 + 0xc;
    if (uVar4 != 0) {
      uVar13 = (uint)(ushort)(*(ushort *)(puVar2 + uVar10 + 8) << 8 |
                             *(ushort *)(puVar2 + uVar10 + 8) >> 8);
      do {
        uVar13 = uVar13 >> 1;
        uVar16 = uVar13 & 0xfffffffe;
        if ((int)codepoint <=
            (int)(uint)(ushort)(*(ushort *)(puVar2 + (ulong)uVar16 + (ulong)uVar15) << 8 |
                               *(ushort *)(puVar2 + (ulong)uVar16 + (ulong)uVar15) >> 8)) {
          uVar16 = 0;
        }
        uVar15 = uVar16 + uVar15;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    uVar17 = (ulong)((uVar15 - uVar8) + 0x1fff4 & 0x1fffe);
    uVar13 = (uint)(ushort)(*(ushort *)(puVar2 + uVar17 + (uVar7 & 0xfffffffe) + uVar10 + 0x10) << 8
                           | *(ushort *)(puVar2 + uVar17 + (uVar7 & 0xfffffffe) + uVar10 + 0x10) >>
                             8);
    uVar15 = 0;
    if (((int)uVar13 <= (int)codepoint) &&
       (uVar15 = 0,
       (int)codepoint <=
       (int)(uint)(ushort)(*(ushort *)(puVar2 + uVar17 + (uVar8 + 0xe)) << 8 |
                          *(ushort *)(puVar2 + uVar17 + (uVar8 + 0xe)) >> 8))) {
      uVar7 = uVar7 >> 1;
      lVar3 = (ulong)((uint)uVar7 + (uint)uVar7) * 3;
      uVar4 = *(ushort *)(puVar2 + uVar17 + 2 + lVar3 + uVar10 + 0xe) << 8 |
              *(ushort *)(puVar2 + uVar17 + 2 + lVar3 + uVar10 + 0xe) >> 8;
      if (uVar4 == 0) {
        uVar15 = (ushort)(*(ushort *)(puVar2 + uVar17 + 2 + (ulong)uVar7 * 4 + uVar10 + 0xe) << 8 |
                         *(ushort *)(puVar2 + uVar17 + 2 + (ulong)uVar7 * 4 + uVar10 + 0xe) >> 8) +
                 codepoint;
      }
      else {
        uVar15 = (uint)(ushort)(*(ushort *)
                                 (puVar2 + uVar17 + 0x10 +
                                           (long)(int)((codepoint - uVar13) * 2) +
                                           lVar3 + uVar10 + uVar4) << 8 |
                               *(ushort *)
                                (puVar2 + uVar17 + 0x10 +
                                          (long)(int)((codepoint - uVar13) * 2) +
                                          lVar3 + uVar10 + uVar4) >> 8);
      }
    }
    uVar15 = uVar15 & 0xffff;
    break;
  case 6:
    uVar7 = *(ushort *)(puVar2 + uVar10 + 6) << 8 | *(ushort *)(puVar2 + uVar10 + 6) >> 8;
    uVar15 = 0;
    if ((uVar7 <= codepoint) &&
       (codepoint <
        (uint)(ushort)(*(ushort *)(puVar2 + uVar10 + 8) << 8 | *(ushort *)(puVar2 + uVar10 + 8) >> 8
                      ) + (uint)uVar7)) {
      uVar15 = (uint)(ushort)(*(ushort *)(puVar2 + (ulong)((codepoint - uVar7) * 2) + uVar10 + 10)
                              << 8 | *(ushort *)
                                      (puVar2 + (ulong)((codepoint - uVar7) * 2) + uVar10 + 10) >> 8
                             );
    }
  }
LAB_001251d6:
  info = &face->info;
  *(uint *)((long)pvertices + 0xc) = uVar15;
  iVar5 = stbtt_GetGlyphShape(info,uVar15,pvertices);
  *(int *)(pvertices + 1) = iVar5;
  iVar5 = *(int *)((long)pvertices + 0xc);
  puVar2 = (face->info).data;
  uVar7 = *(ushort *)(puVar2 + (long)(face->info).hhea + 0x22) << 8 |
          *(ushort *)(puVar2 + (long)(face->info).hhea + 0x22) >> 8;
  iVar1 = (face->info).hmtx;
  if (iVar5 < (int)(uint)uVar7) {
    puVar9 = (ushort *)((long)(puVar2 + (long)iVar5 * 4 + (long)iVar1) + 2);
    uVar7 = *(ushort *)(puVar2 + (long)iVar5 * 4 + (long)iVar1);
    uVar4 = uVar7 << 8 | uVar7 >> 8;
    lVar3 = (long)iVar5 * 4 + (long)iVar1 + 3;
  }
  else {
    lVar3 = (ulong)uVar7 * 4 + (long)iVar1;
    uVar4 = *(ushort *)(puVar2 + (ulong)uVar7 * 4 + (long)iVar1 + -4) << 8 |
            *(ushort *)(puVar2 + (ulong)uVar7 * 4 + (long)iVar1 + -4) >> 8;
    lVar11 = (long)(int)((iVar5 - (uint)uVar7) * 2);
    puVar9 = (ushort *)(puVar2 + lVar11 + lVar3);
    lVar3 = lVar11 + lVar3 + 1;
  }
  *(int *)(pvertices + 2) = (int)(short)uVar4;
  *(uint *)((long)pvertices + 0x14) = (int)(short)((ushort)(byte)*puVar9 << 8) | (uint)puVar2[lVar3]
  ;
  if ((face->info).cff.size == 0) {
    uVar8 = stbtt__GetGlyfOffset(info,iVar5);
    if (-1 < (int)uVar8) {
      puVar2 = (face->info).data;
      *(uint *)(pvertices + 3) =
           (int)(short)((ushort)puVar2[(ulong)uVar8 + 2] << 8) | (uint)puVar2[(ulong)uVar8 + 3];
      *(uint *)((long)pvertices + 0x1c) =
           (int)(short)((ushort)puVar2[(ulong)uVar8 + 4] << 8) | (uint)puVar2[(ulong)uVar8 + 5];
      *(uint *)(pvertices + 4) =
           (int)(short)((ushort)puVar2[(ulong)uVar8 + 6] << 8) | (uint)puVar2[(ulong)uVar8 + 7];
      *(uint *)((long)pvertices + 0x24) =
           (int)(short)((ushort)puVar2[(ulong)uVar8 + 8] << 8) | (uint)puVar2[(ulong)uVar8 + 9];
      goto LAB_00125341;
    }
    uVar8 = 0;
    uVar15 = 0;
    uVar13 = 0;
    uVar16 = 0;
  }
  else {
    local_68.first_x = 0.0;
    local_68.first_y = 0.0;
    local_68.min_y = 0;
    local_68.max_y = 0;
    local_68.pvertices = (stbtt_vertex *)0x0;
    local_68.x = 0.0;
    local_68.y = 0.0;
    local_68.min_x = 0;
    local_68.max_x = 0;
    local_68.num_vertices = 0;
    local_68._52_4_ = 0;
    local_68.bounds = 1;
    local_68.started = 0;
    iVar5 = stbtt__run_charstring(info,iVar5,&local_68);
    uVar16 = (uint)(iVar5 == 0);
    uVar8 = ~((int)(uVar16 << 0x1f) >> 0x1f) & local_68.min_x;
    uVar13 = ~((int)(uVar16 << 0x1f) >> 0x1f) & local_68.max_x;
    uVar15 = ~((int)(uVar16 << 0x1f) >> 0x1f) & local_68.min_y;
    uVar16 = ~((int)(uVar16 << 0x1f) >> 0x1f) & local_68.max_y;
  }
  *(uint *)(pvertices + 3) = uVar8;
  *(uint *)((long)pvertices + 0x1c) = uVar15;
  *(uint *)(pvertices + 4) = uVar13;
  *(uint *)((long)pvertices + 0x24) = uVar16;
LAB_00125341:
  uVar10 = (ulong)(uint)((int)((ulong)codepoint & 0xff) << 3);
  *(stbtt_vertex ***)((long)face->glyphs[uVar12] + uVar10) = pvertices;
  return *(glyph_t **)((long)face->glyphs[uVar12] + uVar10);
}

Assistant:

static glyph_t* plutovg_font_face_get_glyph(plutovg_font_face_t* face, plutovg_codepoint_t codepoint)
{
    unsigned int msb = (codepoint >> 8) & 0xFF;
    if(face->glyphs[msb] == NULL) {
        face->glyphs[msb] = calloc(GLYPH_CACHE_SIZE, sizeof(glyph_t*));
    }

    unsigned int lsb = codepoint & 0xFF;
    if(face->glyphs[msb][lsb] == NULL) {
        glyph_t* glyph = malloc(sizeof(glyph_t));
        glyph->index = stbtt_FindGlyphIndex(&face->info, codepoint);
        glyph->nvertices = stbtt_GetGlyphShape(&face->info, glyph->index, &glyph->vertices);
        stbtt_GetGlyphHMetrics(&face->info, glyph->index, &glyph->advance_width, &glyph->left_side_bearing);
        if(!stbtt_GetGlyphBox(&face->info, glyph->index, &glyph->x1, &glyph->y1, &glyph->x2, &glyph->y2))
            glyph->x1 = glyph->y1 = glyph->x2 = glyph->y2 = 0;
        face->glyphs[msb][lsb] = glyph;
    }

    return face->glyphs[msb][lsb];
}